

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sLongRunningShaderTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Stress::anon_unknown_1::LongRunningShaderCase::iterate(LongRunningShaderCase *this)

{
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar4;
  code *pcVar3;
  pointer piVar5;
  pointer piVar6;
  pointer pVVar7;
  pointer pVVar8;
  int iVar9;
  deUint32 dVar10;
  float fVar11;
  undefined4 uVar12;
  undefined4 extraout_var;
  RenderTarget *pRVar14;
  Params *pPVar15;
  NotSupportedError *this_00;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  size_type __n;
  float *pfVar20;
  int iVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  uint uVar24;
  uint uVar26;
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  vector<int,_std::allocator<int>_> iterCounts;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> positions;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> vertexArrays;
  Random rnd;
  long *local_128;
  long local_120;
  long local_118 [2];
  vector<int,_std::allocator<int>_> local_108;
  Type local_f0;
  long *local_e8;
  long local_e0;
  long local_d8 [2];
  int local_c8;
  undefined1 local_c0 [8];
  _Alloc_hider local_b8;
  undefined1 local_b0 [24];
  int local_98;
  VertexArrayPointer local_90;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> local_70;
  undefined1 local_58 [16];
  pointer local_48;
  deRandom local_40;
  long lVar13;
  
  iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar13 = CONCAT44(extraout_var,iVar9);
  pPVar15 = this->m_params;
  dVar10 = deStringHash(pPVar15->name);
  uVar19 = (pPVar15->shaderType >> 0x10 ^ pPVar15->shaderType ^ 0x3d) * 9;
  uVar16 = (uVar19 >> 4 ^ uVar19) * 0x27d4eb2d;
  uVar19 = *(uint *)((long)&pPVar15[1].name + 4);
  uVar18 = (pPVar15->loopType >> 0x10 ^ pPVar15->loopType ^ 0x3d) * 9;
  uVar24 = (pPVar15->iterCountType >> 0x10 ^ pPVar15->iterCountType ^ 0x3d) * 9;
  auVar23._4_4_ = uVar24;
  auVar23._0_4_ = uVar18;
  uVar26 = (*(uint *)&pPVar15[1].name >> 0x10 ^ *(uint *)&pPVar15[1].name ^ 0x3d) * 9;
  auVar23._8_4_ = uVar26;
  uVar19 = (uVar19 >> 0x10 ^ uVar19 ^ 0x3d) * 9;
  auVar23._12_4_ = uVar19;
  auVar25._0_4_ = uVar18 >> 4;
  auVar25._4_4_ = uVar24 >> 4;
  auVar25._8_4_ = uVar26 >> 4;
  auVar25._12_4_ = uVar19 >> 4;
  auVar25 = auVar25 ^ auVar23;
  iVar9 = auVar25._4_4_;
  auVar28._4_4_ = iVar9;
  auVar28._0_4_ = iVar9;
  auVar28._8_4_ = auVar25._12_4_;
  auVar28._12_4_ = auVar25._12_4_;
  uVar24 = auVar25._0_4_ * 0x27d4eb2d;
  uVar26 = (uint)((auVar25._8_8_ & 0xffffffff) * 0x27d4eb2d);
  uVar18 = (uint)((auVar28._8_8_ & 0xffffffff) * 0x27d4eb2d);
  uVar19 = ((uint)pPVar15->numInvocations >> 0x10 ^ pPVar15->numInvocations ^ 0x3d) * 9;
  uVar19 = (uVar19 >> 4 ^ uVar19) * 0x27d4eb2d;
  deRandom_init(&local_40,
                uVar19 >> 0xf ^ dVar10 ^
                uVar18 >> 0xf ^ uVar19 ^ uVar18 ^ iVar9 * 0x27d4eb2d ^ uVar26 ^ uVar24 ^ uVar16 ^
                (uVar16 ^ iVar9 * 0x27d4eb2d ^ uVar26 ^ uVar24) >> 0xf);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            (&local_70,(long)this->m_params->numInvocations,(allocator_type *)local_c0);
  __n = 1;
  if (this->m_params->iterCountType == ITERCOUNTTYPE_DYNAMIC) {
    __n = (size_type)this->m_params->numInvocations;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_108,__n,(allocator_type *)local_c0);
  local_58 = (undefined1  [16])0x0;
  local_48 = (pointer)0x0;
  local_128 = local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"a_position","");
  pVVar8 = local_70.
           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pVVar7 = local_70.
           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_f0 = TYPE_NAME;
  local_e8 = local_d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,local_128,local_120 + (long)local_128);
  local_c8 = 0;
  local_c0._0_4_ = local_f0;
  pcVar1 = local_b0 + 8;
  local_b8._M_p = pcVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_e8,local_e0 + (long)local_e8);
  local_98 = local_c8;
  local_90.componentType = VTX_COMP_FLOAT;
  local_90.convert = VTX_COMP_CONVERT_NONE;
  local_90.numComponents = 2;
  local_90.numElements = (int)((ulong)((long)pVVar8 - (long)pVVar7) >> 3);
  local_90.stride = 0;
  local_90.data = pVVar7;
  if (local_e8 != local_d8) {
    operator_delete(local_e8,local_d8[0] + 1);
  }
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
  emplace_back<glu::VertexArrayBinding>
            ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)local_58,
             (VertexArrayBinding *)local_c0);
  if (local_b8._M_p != pcVar1) {
    operator_delete(local_b8._M_p,local_b0._8_8_ + 1);
  }
  if (local_128 != local_118) {
    operator_delete(local_128,local_118[0] + 1);
  }
  if (this->m_params->iterCountType == ITERCOUNTTYPE_DYNAMIC) {
    local_128 = local_118;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"a_iterCount","");
    piVar6 = local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish;
    piVar5 = local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
    local_f0 = TYPE_NAME;
    local_e8 = local_d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,local_128,local_120 + (long)local_128);
    local_c8 = 0;
    local_c0._0_4_ = local_f0;
    local_b8._M_p = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,local_e8,local_e0 + (long)local_e8);
    local_98 = local_c8;
    local_90.componentType = VTX_COMP_SIGNED_INT32;
    local_90.convert = VTX_COMP_CONVERT_NONE;
    local_90.numComponents = 1;
    local_90.numElements = (int)((ulong)((long)piVar6 - (long)piVar5) >> 2);
    local_90.stride = 0;
    local_90.data = piVar5;
    if (local_e8 != local_d8) {
      operator_delete(local_e8,local_d8[0] + 1);
    }
    std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
    emplace_back<glu::VertexArrayBinding>
              ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)local_58
               ,(VertexArrayBinding *)local_c0);
    if (local_b8._M_p != pcVar1) {
      operator_delete(local_b8._M_p,local_b0._8_8_ + 1);
    }
    if (local_128 != local_118) {
      operator_delete(local_128,local_118[0] + 1);
    }
  }
  pRVar14 = Context::getRenderTarget((this->super_TestCase).m_context);
  uVar2 = pRVar14->m_width;
  uVar4 = pRVar14->m_height;
  uVar19 = (uint)((ulong)((long)local_70.
                                super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_70.
                               super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if ((int)uVar19 <= (int)(uVar4 * uVar2)) {
    if (0 < (int)uVar19) {
      auVar22._0_4_ = (float)(int)uVar2;
      auVar22._4_4_ = (float)(int)uVar4;
      auVar22._8_8_ = 0;
      uVar17 = 0;
      do {
        uVar18 = (int)uVar17 >> 0x1f;
        auVar27._0_4_ =
             (float)(int)((long)((ulong)uVar18 << 0x20 | uVar17 & 0xffffffff) % (long)(int)uVar2) +
             0.5;
        auVar27._4_4_ =
             (float)(int)((long)((ulong)uVar18 << 0x20 | uVar17 & 0xffffffff) / (long)(int)uVar4) +
             0.5;
        auVar27._8_8_ = 0;
        auVar28 = divps(auVar27,auVar22);
        *(ulong *)local_70.
                  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar17].m_data =
             CONCAT44(auVar28._4_4_ + auVar28._4_4_ + -1.0,auVar28._0_4_ + auVar28._0_4_ + -1.0);
        uVar17 = uVar17 + 1;
      } while ((uVar19 & 0x7fffffff) != uVar17);
    }
    if (local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      pfVar20 = (float *)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
      do {
        iVar9 = this->m_params->minLoopIterCount;
        iVar21 = this->m_params->maxLoopIterCount;
        fVar11 = (float)deRandom_getUint32(&local_40);
        if (iVar21 != 0x7fffffff || iVar9 != -0x80000000) {
          fVar11 = (float)((uint)fVar11 % ((iVar21 - iVar9) + 1U) + iVar9);
        }
        ((pointer)pfVar20)->m_data[0] = fVar11;
        pfVar20 = ((pointer)pfVar20)->m_data + 1;
      } while (pfVar20 !=
               (float *)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish);
    }
    (**(code **)(lVar13 + 0x1680))((this->m_program->m_program).m_program);
    pPVar15 = this->m_params;
    if (pPVar15->iterCountType == ITERCOUNTTYPE_UNIFORM) {
      pcVar3 = *(code **)(lVar13 + 0x14f0);
      uVar12 = (**(code **)(lVar13 + 0xb48))((this->m_program->m_program).m_program,"u_iterCount");
      (*pcVar3)(uVar12,*(float *)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start);
      pPVar15 = this->m_params;
    }
    local_c0._4_4_ = pPVar15->numInvocations;
    local_c0._0_4_ = 6;
    local_b8._M_p._0_4_ = 3;
    local_b0._0_8_ = (void *)0x0;
    glu::draw(((this->super_TestCase).m_context)->m_renderCtx,(this->m_program->m_program).m_program
              ,(int)((ulong)(local_58._8_8_ - local_58._0_8_) >> 4) * -0x33333333,
              (VertexArrayBinding *)local_58._0_8_,(PrimitiveList *)local_c0,(DrawUtilCallback *)0x0
             );
    iVar9 = this->m_numCaseIters;
    iVar21 = this->m_caseIterNdx + 1;
    this->m_caseIterNdx = iVar21;
    std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::~vector
              ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)local_58
              );
    if ((pointer)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_70.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.
                      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_70.
                            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.
                            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return (IterateResult)(iVar21 < iVar9);
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_c0 = (undefined1  [8])local_b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c0,"Too small viewport to fit all test points","");
  tcu::NotSupportedError::NotSupportedError(this_00,(string *)local_c0);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

LongRunningShaderCase::IterateResult LongRunningShaderCase::iterate (void)
{
	const glw::Functions&			gl				= m_context.getRenderContext().getFunctions();
	de::Random						rnd				(getSeed(*m_params));
	vector<Vec2>					positions		(m_params->numInvocations);
	vector<int>						iterCounts		(m_params->iterCountType == ITERCOUNTTYPE_DYNAMIC ? m_params->numInvocations : 1);
	vector<glu::VertexArrayBinding>	vertexArrays;

	vertexArrays.push_back(glu::va::Float("a_position", 2, (int)positions.size(), 0, positions[0].getPtr()));
	if (m_params->iterCountType == ITERCOUNTTYPE_DYNAMIC)
		vertexArrays.push_back(glu::va::Int32("a_iterCount", 1, (int)iterCounts.size(), 0, &iterCounts[0]));

	genPositions(m_context.getRenderTarget(), (int)positions.size(), &positions[0]);

	for (vector<int>::iterator i = iterCounts.begin(); i != iterCounts.end(); ++i)
		*i = rnd.getInt(m_params->minLoopIterCount, m_params->maxLoopIterCount);

	gl.useProgram(m_program->getProgram());

	if (m_params->iterCountType == ITERCOUNTTYPE_UNIFORM)
		gl.uniform1i(gl.getUniformLocation(m_program->getProgram(), "u_iterCount"), iterCounts[0]);

	glu::draw(m_context.getRenderContext(), m_program->getProgram(),
			  (int)vertexArrays.size(), &vertexArrays[0],
			  glu::pr::Points(m_params->numInvocations));

	m_caseIterNdx += 1;
	return (m_caseIterNdx < m_numCaseIters) ? CONTINUE : STOP;
}